

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u8 sqlite3GetVarint32(uchar *p,u32 *v)

{
  byte bVar1;
  u8 uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = p[1];
  if ((char)bVar1 < '\0') {
    if ((char)p[2] < '\0') {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      uVar2 = sqlite3GetVarint(p,(u64 *)&local_20);
      uVar3 = -(uint)((ulong)local_20 >> 0x20 != 0) | (uint)local_20;
    }
    else {
      uVar3 = (bVar1 & 0x7f) << 7 | (*p & 0x7f) << 0xe | (int)(char)p[2];
      uVar2 = '\x03';
    }
  }
  else {
    uVar3 = (*p & 0x7f) << 7 | (uint)bVar1;
    uVar2 = '\x02';
  }
  *v = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE u8 sqlite3GetVarint32(const unsigned char *p, u32 *v){
  u64 v64;
  u8 n;

  /* Assume that the single-byte case has already been handled by
  ** the getVarint32() macro */
  assert( (p[0] & 0x80)!=0 );

  if( (p[1] & 0x80)==0 ){
    /* This is the two-byte case */
    *v = ((p[0]&0x7f)<<7) | p[1];
    return 2;
  }
  if( (p[2] & 0x80)==0 ){
    /* This is the three-byte case */
    *v = ((p[0]&0x7f)<<14) | ((p[1]&0x7f)<<7) | p[2];
    return 3;
  }
  /* four or more bytes */
  n = sqlite3GetVarint(p, &v64);
  assert( n>3 && n<=9 );
  if( (v64 & SQLITE_MAX_U32)!=v64 ){
    *v = 0xffffffff;
  }else{
    *v = (u32)v64;
  }
  return n;
}